

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_add_tet_without_faceid(REF_CAVITY ref_cavity,REF_INT tet,REF_INT faceid)

{
  int iVar1;
  int iVar2;
  REF_GRID pRVar3;
  REF_CELL pRVar4;
  REF_NODE pRVar5;
  REF_CELL pRVar6;
  REF_INT *pRVar7;
  REF_INT *pRVar8;
  REF_MPI pRVar9;
  REF_INT *pRVar10;
  long lVar11;
  uint uVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  REF_INT already_have_it;
  REF_INT tri_index;
  REF_INT face_nodes [3];
  uint local_68;
  int local_60;
  int local_5c;
  REF_CELL local_58;
  REF_NODE local_50;
  long local_48;
  REF_INT local_3c [3];
  
  if (-1 < tet) {
    pRVar3 = ref_cavity->ref_grid;
    pRVar4 = pRVar3->cell[8];
    if ((tet < pRVar4->max) &&
       (local_48 = (long)tet, pRVar4->c2n[pRVar4->size_per * local_48] != -1)) {
      pRVar5 = pRVar3->node;
      pRVar6 = pRVar3->cell[3];
      uVar12 = ref_list_contains(ref_cavity->tet_list,tet,&local_60);
      if (uVar12 != 0) {
        pcVar16 = "have tet?";
        uVar13 = 0x255;
LAB_001c5098:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar13,"ref_cavity_add_tet_without_faceid",(ulong)uVar12,pcVar16);
        return uVar12;
      }
      if (local_60 != 0) {
        return 0;
      }
      local_58 = pRVar6;
      local_50 = pRVar5;
      uVar12 = ref_list_push(ref_cavity->tet_list,tet);
      lVar11 = local_48;
      if (uVar12 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               600,"ref_cavity_add_tet_without_faceid",(ulong)uVar12,"save tet");
        return uVar12;
      }
      if (pRVar4->face_per < 1) {
        return 0;
      }
      lVar17 = 0;
      lVar14 = 0;
      local_68 = 0;
      do {
        pRVar7 = pRVar4->c2n;
        pRVar8 = local_50->part;
        pRVar9 = local_50->ref_mpi;
        iVar1 = pRVar4->size_per;
        pRVar10 = pRVar4->f2n;
        lVar15 = 0;
        do {
          iVar2 = pRVar7[(long)*(int *)((long)pRVar10 + lVar15 * 4 + lVar17) + iVar1 * lVar11];
          local_3c[lVar15] = iVar2;
          if (pRVar9->id != pRVar8[iVar2]) {
            ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
            return 0;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        uVar12 = ref_cell_with(local_58,local_3c,&local_5c);
        if ((uVar12 != 0) && (uVar12 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x264,"ref_cavity_add_tet_without_faceid",(ulong)uVar12,"search for boundary tri");
          local_68 = uVar12;
        }
        if ((uVar12 != 5) && (uVar12 != 0)) {
          return local_68;
        }
        if (((long)local_5c == -1) ||
           (local_58->c2n[(long)local_58->size_per * (long)local_5c + 3] != faceid)) {
          uVar12 = ref_cavity_insert_face(ref_cavity,local_3c);
          if (uVar12 != 0) {
            pcVar16 = "tet side";
            uVar13 = 0x26a;
            goto LAB_001c5098;
          }
          if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
            return 0;
          }
        }
        lVar14 = lVar14 + 1;
        lVar17 = lVar17 + 0x10;
        if (pRVar4->face_per <= lVar14) {
          return 0;
        }
      } while( true );
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x252,
         "ref_cavity_add_tet_without_faceid","invalid tet");
  return 1;
}

Assistant:

static REF_FCN REF_STATUS ref_cavity_add_tet_without_faceid(
    REF_CAVITY ref_cavity, REF_INT tet, REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL tet_cell = ref_grid_tet(ref_grid);
  REF_CELL tri_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell_face, node, tri_index;
  REF_INT face_nodes[3];
  REF_INT already_have_it;

  RAS(ref_cell_valid(tet_cell, tet), "invalid tet");

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet, &already_have_it),
      "have tet?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), tet), "save tet");

  each_ref_cell_cell_face(tet_cell, cell_face) {
    each_ref_cavity_face_node(ref_cavity, node) {
      face_nodes[node] = ref_cell_f2n(tet_cell, node, cell_face, tet);
      if (!ref_node_owned(ref_node, face_nodes[node])) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }

    RXS(ref_cell_with(tri_cell, face_nodes, &tri_index), REF_NOT_FOUND,
        "search for boundary tri");
    if (REF_EMPTY != tri_index &&
        ref_cell_c2n(tri_cell, 3, tri_index) == faceid) {
      continue;
    }

    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}